

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void select_statically(saucy *s,int *target,int *lmin,int *rmin)

{
  int iVar1;
  int local_2c;
  int i;
  int *rmin_local;
  int *lmin_local;
  int *target_local;
  saucy *s_local;
  
  iVar1 = (s->left).cfront[s->splitvar[s->lev]];
  *rmin = iVar1;
  *target = iVar1;
  *lmin = (s->left).unlab[s->splitvar[s->lev]];
  local_2c = *rmin;
  while( true ) {
    if (*rmin + (s->right).clen[*target] < local_2c) {
      return;
    }
    if ((s->right).lab[*rmin] == (s->left).lab[*lmin]) break;
    local_2c = local_2c + 1;
  }
  *rmin = local_2c;
  return;
}

Assistant:

static void
select_statically(struct saucy *s, int *target, int *lmin, int *rmin)
{
    int i;

    *target = *rmin = s->left.cfront[s->splitvar[s->lev]];
    *lmin = s->left.unlab[s->splitvar[s->lev]];
    /* try to map identically! */
    for (i = *rmin; i <= (*rmin + s->right.clen[*target]); i++)
        if (s->right.lab[*rmin] == s->left.lab[*lmin]) {
            *rmin = i;
            break;
        }
}